

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.h
# Opt level: O0

void absl::strings_internal::Base64EscapeInternal<std::__cxx11::string>
               (uchar *src,size_t szsrc,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dest,
               bool do_padding,char *base64_chars)

{
  size_t sVar1;
  size_t sVar2;
  ulong in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  size_t in_stack_00000010;
  uchar *in_stack_00000018;
  size_t escaped_len;
  size_t calc_escaped_size;
  size_t in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 do_padding_00;
  
  do_padding_00 = (undefined1)((ulong)in_RSI >> 0x38);
  sVar1 = CalculateBase64EscapedLenInternal((size_t)dest,do_padding);
  STLStringResizeUninitialized<std::__cxx11::string,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::operator[](in_RDX);
  std::__cxx11::string::size();
  sVar2 = Base64EscapeInternal
                    (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,
                     (bool)do_padding_00);
  if (sVar1 == sVar2) {
    std::__cxx11::string::erase(in_RDX,sVar2);
    return;
  }
  __assert_fail("calc_escaped_size == escaped_len",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/escaping.h"
                ,0x31,
                "void absl::strings_internal::Base64EscapeInternal(const unsigned char *, size_t, String *, bool, const char *) [String = std::basic_string<char>]"
               );
}

Assistant:

void Base64EscapeInternal(const unsigned char* src, size_t szsrc, String* dest,
                          bool do_padding, const char* base64_chars) {
  const size_t calc_escaped_size =
      CalculateBase64EscapedLenInternal(szsrc, do_padding);
  STLStringResizeUninitialized(dest, calc_escaped_size);

  const size_t escaped_len = Base64EscapeInternal(
      src, szsrc, &(*dest)[0], dest->size(), base64_chars, do_padding);
  assert(calc_escaped_size == escaped_len);
  dest->erase(escaped_len);
}